

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O2

void xmlDebugDumpOneNode(FILE *output,xmlNodePtr node,int depth)

{
  xmlDebugCtxt ctxt;
  xmlDebugCtxt local_c0;
  
  if (output != (FILE *)0x0) {
    xmlCtxtDumpInitCtxt(&local_c0);
    local_c0.output = output;
    local_c0.depth = depth;
    xmlCtxtDumpOneNode(&local_c0,node);
  }
  return;
}

Assistant:

void
xmlDebugDumpOneNode(FILE * output, xmlNodePtr node, int depth)
{
    xmlDebugCtxt ctxt;

    if (output == NULL) return;
    xmlCtxtDumpInitCtxt(&ctxt);
    ctxt.output = output;
    ctxt.depth = depth;
    xmlCtxtDumpOneNode(&ctxt, node);
    xmlCtxtDumpCleanCtxt(&ctxt);
}